

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2FloatingPointFullMatchTypes(void)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  float v;
  double v_1;
  StringPiece local_1e0;
  LogMessageFatal local_1d0;
  string zeros;
  
  zeros._M_dataplus._M_p = (pointer)&zeros.field_2;
  std::__cxx11::string::_M_construct((ulong)&zeros,-0x18);
  local_210._M_dataplus._M_p = "100";
  local_210._M_string_length._0_4_ = 3;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v;
  bVar1 = RE2::FullMatch<float*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(float **)&local_1e0);
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35e);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"100\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v != 100.0) || (NAN(v))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35e);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (100)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "-100.";
  local_210._M_string_length._0_4_ = 5;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v;
  bVar1 = RE2::FullMatch<float*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(float **)&local_1e0);
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35f);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"-100.\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v != -100.0) || (NAN(v))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35f);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (-100)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "1e23";
  local_210._M_string_length._0_4_ = 4;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v;
  bVar1 = RE2::FullMatch<float*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(float **)&local_1e0);
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x360);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"1e23\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v != 1e+23) || (NAN(v))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x360);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (float(1e23))"
                   );
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = " 100";
  local_210._M_string_length._0_4_ = 4;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v;
  bVar1 = RE2::FullMatch<float*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(float **)&local_1e0);
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x361);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\" 100\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v != 100.0) || (NAN(v))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x361);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (100)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  std::operator+(&local_210,&zeros,"1e23");
  local_1e0.ptr_ = local_210._M_dataplus._M_p;
  local_1e0.length_ = (int)local_210._M_string_length;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  v_1 = (double)&v;
  bVar1 = RE2::FullMatch<float*>(&local_1e0,(RE2 *)&local_1d0,(float **)&v_1);
  RE2::~RE2((RE2 *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x363);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(zeros + \"1e23\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v != 1e+23) || (NAN(v))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x364);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (float(1e23))"
                   );
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "0.1";
  local_210._M_string_length._0_4_ = 3;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v;
  bVar1 = RE2::FullMatch<float*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(float **)&local_1e0);
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x376);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"0.1\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v != 0.1) || (NAN(v))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x377);
    poVar2 = std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                             "Check failed: (v) == (0.1f)");
    StringPrintf_abi_cxx11_(&local_210,"%.8g != %.8g",(double)v,0x3fb99999a0000000);
    std::operator<<(poVar2,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "6700000000081920.1";
  local_210._M_string_length._0_4_ = 0x12;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v;
  bVar1 = RE2::FullMatch<float*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(float **)&local_1e0);
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x378);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"6700000000081920.1\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v != 6.7000003e+15) || (NAN(v))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x379);
    poVar2 = std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                             "Check failed: (v) == (6700000000081920.1f)");
    StringPrintf_abi_cxx11_(&local_210,"%.8g != %.8g",(double)v,0x4337cd9d60000000);
    std::operator<<(poVar2,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "100";
  local_210._M_string_length._0_4_ = 3;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v_1;
  bVar1 = RE2::FullMatch<double*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(double **)&local_1e0)
  ;
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x37f);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"100\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v_1 != 100.0) || (NAN(v_1))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x37f);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (100)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "-100.";
  local_210._M_string_length._0_4_ = 5;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v_1;
  bVar1 = RE2::FullMatch<double*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(double **)&local_1e0)
  ;
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x380);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"-100.\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v_1 != -100.0) || (NAN(v_1))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x380);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (-100)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "1e23";
  local_210._M_string_length._0_4_ = 4;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v_1;
  bVar1 = RE2::FullMatch<double*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(double **)&local_1e0)
  ;
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x381);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"1e23\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v_1 != 1e+23) || (NAN(v_1))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x381);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,"Check failed: (v) == (1e23)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  std::operator+(&local_210,&zeros,"1e23");
  local_1e0.ptr_ = local_210._M_dataplus._M_p;
  local_1e0.length_ = (int)local_210._M_string_length;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  _v = (float **)&v_1;
  bVar1 = RE2::FullMatch<double*>(&local_1e0,(RE2 *)&local_1d0,(double **)&v);
  RE2::~RE2((RE2 *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x382);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(zeros + \"1e23\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v_1 != 1e+23) || (NAN(v_1))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,899);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: (v) == (double(1e23))");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "0.1";
  local_210._M_string_length._0_4_ = 3;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v_1;
  bVar1 = RE2::FullMatch<double*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(double **)&local_1e0)
  ;
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x385);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"0.1\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v_1 != 0.1) || (NAN(v_1))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x386);
    poVar2 = std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                             "Check failed: (v) == (0.1)");
    StringPrintf_abi_cxx11_(&local_210,"%.17g != %.17g",v_1,0x3fb999999999999a);
    std::operator<<(poVar2,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  local_210._M_dataplus._M_p = "1.00000005960464485";
  local_210._M_string_length._0_4_ = 0x13;
  RE2::RE2((RE2 *)&local_1d0,"(.*)");
  local_1e0.ptr_ = (char *)&v_1;
  bVar1 = RE2::FullMatch<double*>((StringPiece *)&local_210,(RE2 *)&local_1d0,(double **)&local_1e0)
  ;
  RE2::~RE2((RE2 *)&local_1d0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x387);
    std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"1.00000005960464485\", \"(.*)\", &v)");
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  if ((v_1 != 1.0000000596046448) || (NAN(v_1))) {
    LogMessageFatal::LogMessageFatal
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x388);
    poVar2 = std::operator<<((ostream *)&local_1d0.super_LogMessage.str_,
                             "Check failed: (v) == (1.0000000596046448)");
    StringPrintf_abi_cxx11_(&local_210,"%.17g != %.17g",v_1,0x3ff0000010000000);
    std::operator<<(poVar2,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    LogMessageFatal::~LogMessageFatal(&local_1d0);
  }
  std::__cxx11::string::~string((string *)&zeros);
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}